

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep_timespec.cc
# Opt level: O2

nsync_time __thiscall nsync::nsync_time_sleep(nsync *this,nsync_time delay)

{
  long lVar1;
  int iVar2;
  long lVar3;
  nsync *pnVar4;
  long lVar5;
  long lVar6;
  nsync_time nVar7;
  nsync_time a;
  nsync_time b;
  nanoseconds delay_ns;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  
  lVar5 = delay.tv_sec;
  nVar7 = nsync_time_now();
  lVar1 = nVar7.tv_nsec + lVar5;
  lVar6 = nVar7.tv_nsec + -1000000000 + lVar5;
  if (lVar1 < 1000000000) {
    lVar6 = lVar1;
  }
  local_28.__r = (long)this * 1000000000 + lVar5;
  std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>(&local_28);
  a = nsync_time_now();
  lVar5 = a.tv_nsec;
  b.tv_nsec = lVar6;
  b.tv_sec = (__time_t)(this + (ulong)(999999999 < lVar1) + nVar7.tv_sec);
  iVar2 = nsync_time_cmp(a,b);
  if (iVar2 < 0) {
    lVar3 = lVar6 + 1000000000;
    if (lVar5 <= lVar6) {
      lVar3 = lVar6;
    }
    pnVar4 = this + (ulong)(999999999 < lVar1) + nVar7.tv_sec + (-(ulong)(lVar6 < lVar5) - a.tv_sec)
    ;
    lVar3 = lVar3 - lVar5;
  }
  else {
    pnVar4 = (nsync *)0x0;
    lVar3 = 0;
  }
  nVar7.tv_nsec = lVar3;
  nVar7.tv_sec = (__time_t)pnVar4;
  return nVar7;
}

Assistant:

nsync_time nsync_time_sleep (nsync_time delay) {
	nsync_time start = nsync_time_now ();
	nsync_time expected_end = nsync_time_add (start, delay);
	nsync_time remain;
	std::chrono::nanoseconds delay_ns(NSYNC_TIME_NSEC (delay) +
					  NSYNC_NS_IN_S_ * (int64_t) NSYNC_TIME_SEC (delay));
	std::this_thread::sleep_for (delay_ns);
	nsync_time actual_end = nsync_time_now ();
	if (nsync_time_cmp (actual_end, expected_end) < 0) {
		remain = nsync_time_sub (expected_end, actual_end);
	} else {
		remain = nsync_time_zero;
	}
	return (remain);
}